

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int includes_nul(char *s,size_t n)

{
  void *pvVar1;
  
  pvVar1 = memchr(s + 1,0,n - 1);
  return (int)(pvVar1 != (void *)0x0);
}

Assistant:

static int includes_nul(const char *s, size_t n) {
  if (n == 0)
    return 0;
#ifdef __linux__
  /* Accept abstract socket namespace path ("\0/virtual/path"). */
  s++;
  n--;
#endif
  return NULL != memchr(s, '\0', n);
}